

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalInterfaceExamples.cpp
# Opt level: O1

void readGZ1(char *fileName,Array2D<Imath_3_2::half> *rPixels,Array2D<Imath_3_2::half> *gPixels,
            Array2D<float> *zPixels,int *width,int *height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  half *phVar6;
  ulong uVar7;
  float *pfVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  InputFile file;
  FrameBuffer frameBuffer;
  Slice local_68 [56];
  
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::InputFile::InputFile(&file,fileName,iVar3);
  Imf_3_2::InputFile::header();
  piVar4 = (int *)Imf_3_2::Header::dataWindow();
  lVar11 = (long)*piVar4;
  iVar3 = piVar4[1];
  lVar9 = (long)iVar3;
  iVar1 = piVar4[3];
  *width = (piVar4[2] - *piVar4) + 1;
  lVar10 = (iVar1 - lVar9) + 1;
  *height = (int)lVar10;
  iVar1 = *width;
  lVar5 = iVar1 * lVar10;
  uVar7 = 0xffffffffffffffff;
  if (-1 < lVar5) {
    uVar7 = lVar5 * 2;
  }
  phVar6 = (half *)operator_new__(uVar7);
  if (rPixels->_data != (half *)0x0) {
    operator_delete__(rPixels->_data);
  }
  rPixels->_sizeX = lVar10;
  rPixels->_sizeY = (long)iVar1;
  rPixels->_data = phVar6;
  iVar1 = *height;
  iVar2 = *width;
  lVar5 = (long)iVar2 * (long)iVar1;
  uVar7 = 0xffffffffffffffff;
  if (-1 < lVar5) {
    uVar7 = lVar5 * 2;
  }
  phVar6 = (half *)operator_new__(uVar7);
  if (gPixels->_data != (half *)0x0) {
    operator_delete__(gPixels->_data);
  }
  gPixels->_sizeX = (long)iVar1;
  gPixels->_sizeY = (long)iVar2;
  gPixels->_data = phVar6;
  iVar1 = *height;
  iVar2 = *width;
  uVar7 = (long)iVar2 * (long)iVar1;
  pfVar8 = (float *)operator_new__(-(ulong)(uVar7 >> 0x3e != 0) | uVar7 * 4);
  if (zPixels->_data != (float *)0x0) {
    operator_delete__(zPixels->_data);
  }
  zPixels->_sizeX = (long)iVar1;
  zPixels->_sizeY = (long)iVar2;
  zPixels->_data = pfVar8;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Slice::Slice
            (local_68,HALF,(char *)(rPixels->_data + (-lVar11 - *width * lVar9)),2,(long)*width * 2,
             1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)"R");
  Imf_3_2::Slice::Slice
            (local_68,HALF,(char *)(gPixels->_data + (-lVar11 - *width * lVar9)),2,(long)*width * 2,
             1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)"G");
  Imf_3_2::Slice::Slice
            (local_68,FLOAT,(char *)(zPixels->_data + (-lVar11 - *width * lVar9)),4,
             (long)*width << 2,1,1,3.4028234663852886e+38,false,false);
  Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)"Z");
  Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&file);
  Imf_3_2::InputFile::readPixels((int)&file,iVar3);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&frameBuffer);
  Imf_3_2::InputFile::~InputFile(&file);
  return;
}

Assistant:

void
readGZ1 (
    const char      fileName[],
    Array2D<half>&  rPixels,
    Array2D<half>&  gPixels,
    Array2D<float>& zPixels,
    int&            width,
    int&            height)
{
    //
    // Read an image using class InputFile.  Try to read two
    // channels, R and G, of type HALF, and one channel, Z,
    // of type FLOAT.  Store the R, G, and Z pixels in three
    // separate memory buffers.
    // If a channel is missing in the file, the buffer for that
    // channel will be filled with an appropriate default value.
    //
    //	- open the file
    //	- allocate memory for the pixels
    //	- describe the layout of the R, G, and Z pixel buffers
    //	- read the pixels from the file
    //

    InputFile file (fileName);

    Box2i dw = file.header ().dataWindow ();
    width    = dw.max.x - dw.min.x + 1;
    height   = dw.max.y - dw.min.y + 1;

    rPixels.resizeErase (height, width);
    gPixels.resizeErase (height, width);
    zPixels.resizeErase (height, width);

    FrameBuffer frameBuffer;

    frameBuffer.insert ("R",					// name
			Slice (IMF::HALF,			// type
			       (char *) (&rPixels[0][0] -	// base
					 dw.min.x -
					 dw.min.y * width),
			       sizeof (rPixels[0][0]) * 1,	// xStride
			       sizeof (rPixels[0][0]) * width,	// yStride
			       1, 1,				// x/y sampling
			       0.0));				// fillValue

    frameBuffer.insert ("G",					// name
			Slice (IMF::HALF,			// type
			       (char *) (&gPixels[0][0] -	// base
					 dw.min.x -
					 dw.min.y * width),
			       sizeof (gPixels[0][0]) * 1,	// xStride
			       sizeof (gPixels[0][0]) * width,	// yStride
			       1, 1,				// x/y sampling
			       0.0));				// fillValue

    frameBuffer.insert ("Z",					// name
			Slice (IMF::FLOAT,			// type
			       (char *) (&zPixels[0][0] -	// base
					 dw.min.x -
					 dw.min.y * width),
			       sizeof (zPixels[0][0]) * 1,	 // xStride
			       sizeof (zPixels[0][0]) * width,	// yStride
			       1, 1,				// x/y sampling
			       std::numeric_limits<float>::max()));		// fillValue

    file.setFrameBuffer (frameBuffer);
    file.readPixels (dw.min.y, dw.max.y);
}